

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_find_match(lyd_node *siblings,lyd_node *target,ly_bool defaults,ly_ht **dup_inst_ht,
                          lyd_node **match)

{
  lysc_node *local_50;
  LY_ERR local_3c;
  LY_ERR ret__;
  LY_ERR r;
  lyd_node **match_local;
  ly_ht **dup_inst_ht_local;
  ly_bool defaults_local;
  lyd_node *target_local;
  lyd_node *siblings_local;
  
  if (target->schema == (lysc_node *)0x0) {
    if (target->schema == (lysc_node *)0x0) {
      local_50 = target[1].schema;
    }
    else {
      local_50 = (lysc_node *)target->schema->name;
    }
    local_3c = lyd_find_sibling_opaq_next(siblings,(char *)local_50,match);
  }
  else if ((target->schema->nodetype & 0x18) == 0) {
    local_3c = lyd_find_sibling_val(siblings,target->schema,(char *)0x0,0,match);
  }
  else {
    local_3c = lyd_find_sibling_first(siblings,target,match);
  }
  if ((local_3c == LY_SUCCESS) || (local_3c == LY_ENOTFOUND)) {
    siblings_local._4_4_ = lyd_dup_inst_next(match,siblings,dup_inst_ht);
    if (siblings_local._4_4_ == LY_SUCCESS) {
      if (((*match != (lyd_node *)0x0) && (((*match)->flags & 1) != 0)) && (defaults == '\0')) {
        *match = (lyd_node *)0x0;
      }
      siblings_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    siblings_local._4_4_ = local_3c;
  }
  return siblings_local._4_4_;
}

Assistant:

static LY_ERR
lyd_diff_find_match(const struct lyd_node *siblings, const struct lyd_node *target, ly_bool defaults,
        struct ly_ht **dup_inst_ht, struct lyd_node **match)
{
    LY_ERR r;

    if (!target->schema) {
        /* try to find the same opaque node */
        r = lyd_find_sibling_opaq_next(siblings, LYD_NAME(target), match);
    } else if (target->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* try to find the exact instance */
        r = lyd_find_sibling_first(siblings, target, match);
    } else {
        /* try to simply find the node, there cannot be more instances */
        r = lyd_find_sibling_val(siblings, target->schema, NULL, 0, match);
    }
    if (r && (r != LY_ENOTFOUND)) {
        return r;
    }

    /* update match as needed */
    LY_CHECK_RET(lyd_dup_inst_next(match, siblings, dup_inst_ht));

    if (*match && ((*match)->flags & LYD_DEFAULT) && !defaults) {
        /* ignore default nodes */
        *match = NULL;
    }
    return LY_SUCCESS;
}